

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O1

bool google::anon_unknown_1::TryParseLocked
               (CommandLineFlag *flag,FlagValue *flag_value,char *value,string *msg)

{
  char *pcVar1;
  bool bVar2;
  FlagValue *this;
  long lVar3;
  string local_50;
  
  this = FlagValue::New(flag_value);
  bVar2 = FlagValue::ParseFrom(this,value);
  if (bVar2) {
    bVar2 = CommandLineFlag::Validate(flag,this);
    if (bVar2) {
      FlagValue::CopyFrom(flag_value,this);
      bVar2 = true;
      if (msg != (string *)0x0) {
        pcVar1 = flag->name_;
        (anonymous_namespace)::FlagValue::ToString_abi_cxx11_(&local_50,flag_value);
        StringAppendF(msg,"%s set to %s\n",pcVar1,local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      goto LAB_001938f4;
    }
    if (msg != (string *)0x0) {
      (anonymous_namespace)::FlagValue::ToString_abi_cxx11_(&local_50,this);
      StringAppendF(msg,"%sfailed validation of new value \'%s\' for flag \'%s\'\n","ERROR: ",
                    local_50._M_dataplus._M_p,flag->name_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
  }
  else if (msg != (string *)0x0) {
    lVar3 = (long)flag->defvalue_->type_;
    if (6 < lVar3) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags.cc"
                    ,0x1a2,"const char *google::(anonymous namespace)::FlagValue::TypeName() const")
      ;
    }
    bVar2 = false;
    StringAppendF(msg,"%sillegal value \'%s\' specified for %s flag \'%s\'\n","ERROR: ",value,
                  &(anonymous_namespace)::FlagValue::TypeName()::types + lVar3 * 7,flag->name_);
    goto LAB_001938f4;
  }
  bVar2 = false;
LAB_001938f4:
  FlagValue::~FlagValue(this);
  operator_delete(this);
  return bVar2;
}

Assistant:

bool TryParseLocked(const CommandLineFlag* flag, FlagValue* flag_value,
                    const char* value, string* msg) {
  // Use tenative_value, not flag_value, until we know value is valid.
  FlagValue* tentative_value = flag_value->New();
  if (!tentative_value->ParseFrom(value)) {
    if (msg) {
      StringAppendF(msg,
                    "%sillegal value '%s' specified for %s flag '%s'\n",
                    kError, value,
                    flag->type_name(), flag->name());
    }
    delete tentative_value;
    return false;
  } else if (!flag->Validate(*tentative_value)) {
    if (msg) {
      StringAppendF(msg,
          "%sfailed validation of new value '%s' for flag '%s'\n",
          kError, tentative_value->ToString().c_str(),
          flag->name());
    }
    delete tentative_value;
    return false;
  } else {
    flag_value->CopyFrom(*tentative_value);
    if (msg) {
      StringAppendF(msg, "%s set to %s\n",
                    flag->name(), flag_value->ToString().c_str());
    }
    delete tentative_value;
    return true;
  }
}